

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void finalizeAggFunctions(Parse *pParse,AggInfo *pAggInfo)

{
  Vdbe *p;
  long in_RSI;
  long in_RDI;
  ExprList *pList;
  AggInfo_func *pF;
  int i;
  Vdbe *v;
  int in_stack_ffffffffffffffb8;
  int op;
  Vdbe *pVVar1;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 uVar2;
  Vdbe *p_00;
  long *local_28;
  int local_1c;
  
  p = *(Vdbe **)(in_RDI + 0x10);
  local_1c = 0;
  local_28 = *(long **)(in_RSI + 0x30);
  for (; local_1c < *(int *)(in_RSI + 0x38); local_1c = local_1c + 1) {
    p_00 = *(Vdbe **)(*local_28 + 0x20);
    uVar2 = (undefined4)local_28[2];
    if (p_00 == (Vdbe *)0x0) {
      op = 0;
    }
    else {
      op = *(int *)&p_00->db;
    }
    pVVar1 = p;
    sqlite3VdbeAddOp2(p,op,in_stack_ffffffffffffffb8,0);
    sqlite3VdbeAppendP4(p_00,(void *)CONCAT44(uVar2,in_stack_ffffffffffffffc8),
                        (int)((ulong)pVVar1 >> 0x20));
    local_28 = local_28 + 3;
  }
  return;
}

Assistant:

static void finalizeAggFunctions(Parse *pParse, AggInfo *pAggInfo){
  Vdbe *v = pParse->pVdbe;
  int i;
  struct AggInfo_func *pF;
  for(i=0, pF=pAggInfo->aFunc; i<pAggInfo->nFunc; i++, pF++){
    ExprList *pList = pF->pExpr->x.pList;
    assert( !ExprHasProperty(pF->pExpr, EP_xIsSelect) );
    sqlite3VdbeAddOp2(v, OP_AggFinal, pF->iMem, pList ? pList->nExpr : 0);
    sqlite3VdbeAppendP4(v, pF->pFunc, P4_FUNCDEF);
  }
}